

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O0

void __thiscall
ByteCodeGenerator::PushJumpCleanupForLoop(ByteCodeGenerator *this,ParseNode *loopNode,uint loopId)

{
  JumpCleanupInfo local_40;
  uint local_1c;
  ParseNode *pPStack_18;
  uint loopId_local;
  ParseNode *loopNode_local;
  ByteCodeGenerator *this_local;
  
  local_40.tryOp = Nop;
  local_40.label = 0;
  local_40.regSlot1 = 0xffffffff;
  local_40.regSlot2 = 0xffffffff;
  local_40.loopNode = loopNode;
  local_40.loopId = loopId;
  local_1c = loopId;
  pPStack_18 = loopNode;
  loopNode_local = (ParseNode *)this;
  DList<JumpCleanupInfo,_Memory::ArenaAllocator,_RealCount>::Prepend
            (this->jumpCleanupList,&local_40);
  return;
}

Assistant:

void PushJumpCleanupForLoop(ParseNode* loopNode, uint loopId)
    {
        this->jumpCleanupList->Prepend({
            loopNode,
            loopId,
            Js::OpCode::Nop,
            0,
            Js::Constants::NoRegister,
            Js::Constants::NoRegister
        });
    }